

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall
CLIntercept::createCommandQueuePropertiesOverride
          (CLIntercept *this,cl_device_id device,cl_queue_properties *properties,
          cl_queue_properties **pLocalQueueProperties)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  ulong uVar11;
  cl_queue_properties *pcVar12;
  ulong uVar13;
  cl_queue_properties cVar14;
  ulong uVar15;
  long lVar16;
  
  if ((this->m_Config).DefaultQueuePriorityHint == 0) {
    bVar9 = false;
  }
  else {
    bVar9 = checkDeviceForExtension(this,device,"cl_khr_priority_hints");
  }
  if ((this->m_Config).DefaultQueueThrottleHint == 0) {
    bVar10 = false;
  }
  else {
    bVar10 = checkDeviceForExtension(this,device,"cl_khr_throttle_hints");
  }
  bVar8 = true;
  if (properties == (cl_queue_properties *)0x0) {
    uVar11 = 0;
LAB_00179fec:
    uVar13 = uVar11 + 2;
    if (!bVar8) {
      uVar13 = uVar11;
    }
    uVar11 = uVar13 + 4;
    if (bVar10 == false) {
      uVar11 = uVar13;
    }
    lVar16 = 0;
    pcVar12 = (cl_queue_properties *)operator_new__(-(ulong)(uVar11 >> 0x3d != 0) | uVar11 << 3 | 8)
    ;
    *pLocalQueueProperties = pcVar12;
    if (properties != (cl_queue_properties *)0x0) {
      cVar14 = *properties;
      if (cVar14 == 0) {
        lVar16 = 0;
      }
      else {
        bVar1 = (this->m_Config).InOrderQueue;
        bVar2 = (this->m_Config).NoProfilingQueue;
        bVar3 = (this->m_Config).DevicePerfCounterEventBasedSampling;
        bVar4 = (this->m_Config).ITTPerformanceTiming;
        bVar5 = (this->m_Config).DevicePerformanceTiming;
        bVar6 = (this->m_Config).ChromePerformanceTiming;
        lVar16 = 0;
        do {
          pcVar12[lVar16] = cVar14;
          uVar11 = properties[lVar16 + 1];
          if (cVar14 == 0x1093) {
            uVar13 = uVar11 & 0xfffffffffffffffe;
            if ((bVar1 & 1U) == 0) {
              uVar13 = uVar11;
            }
            uVar15 = uVar13 & 0xfffffffffffffffd;
            if ((bVar2 & 1U) == 0) {
              uVar15 = uVar13;
            }
            uVar11 = uVar15 | 2;
            if (((bVar3 | bVar6 | bVar4 | bVar5) & 1U) == 0) {
              uVar11 = uVar15;
            }
          }
          pcVar12[lVar16 + 1] = uVar11;
          cVar14 = properties[lVar16 + 2];
          lVar16 = lVar16 + 2;
        } while (cVar14 != 0);
      }
    }
    if (bVar9 != false) {
      uVar7 = (this->m_Config).DefaultQueuePriorityHint;
      pcVar12[lVar16] = 0x1096;
      pcVar12[lVar16 + 1] = (ulong)uVar7;
      lVar16 = lVar16 + 2;
    }
    if (bVar10 != false) {
      uVar7 = (this->m_Config).DefaultQueueThrottleHint;
      pcVar12[lVar16] = 0x1097;
      pcVar12[lVar16 + 1] = (ulong)uVar7;
      lVar16 = lVar16 + 2;
    }
    if (bVar8) {
      if (((((this->m_Config).DevicePerformanceTiming == false) &&
           ((this->m_Config).ITTPerformanceTiming == false)) &&
          ((this->m_Config).ChromePerformanceTiming == false)) &&
         ((this->m_Config).DevicePerfCounterEventBasedSampling != true)) {
        cVar14 = 0;
      }
      else {
        cVar14 = 2;
      }
      pcVar12[lVar16] = 0x1093;
      pcVar12[lVar16 + 1] = cVar14;
      lVar16 = lVar16 + 2;
    }
    pcVar12[lVar16] = 0;
    return;
  }
  uVar11 = 0;
  do {
    cVar14 = properties[uVar11];
    if ((long)cVar14 < 0x1096) {
      if (cVar14 == 0x1093) {
        bVar8 = false;
      }
      else if (cVar14 == 0) goto LAB_00179fec;
    }
    else if (cVar14 == 0x1096) {
      bVar9 = false;
    }
    else if (cVar14 == 0x1097) {
      bVar10 = false;
    }
    uVar11 = uVar11 + 2;
  } while( true );
}

Assistant:

void CLIntercept::createCommandQueuePropertiesOverride(
    cl_device_id device,
    const cl_queue_properties* properties,
    cl_queue_properties*& pLocalQueueProperties ) const
{
    // We're always going to add command queue properties, unless command queue
    // properties already exist (requesting the same property twice is an
    // error).  We also may add priority hints or throttle hints, in some cases.
    // So, look through the queue properties for these enums.  We need to do
    // this anyways to count the number of property pairs.
    bool    addCommandQueuePropertiesEnum = true;
    bool    addPriorityHintEnum =
                config().DefaultQueuePriorityHint != 0 &&
                checkDeviceForExtension( device, "cl_khr_priority_hints" );
    bool    addThrottleHintEnum =
                config().DefaultQueueThrottleHint != 0 &&
                checkDeviceForExtension( device, "cl_khr_throttle_hints" );

    size_t  numProperties = 0;
    if( properties )
    {
        while( properties[ numProperties ] != 0 )
        {
            switch( properties[ numProperties ] )
            {
            case CL_QUEUE_PROPERTIES:
                addCommandQueuePropertiesEnum = false;
                break;
            case CL_QUEUE_PRIORITY_KHR:
                addPriorityHintEnum = false;
                break;
            case CL_QUEUE_THROTTLE_KHR:
                addThrottleHintEnum = false;
                break;
            default:
                break;
            }
            numProperties += 2;
        }
    }

    if( addCommandQueuePropertiesEnum )
    {
        numProperties += 2;
    }
    if( addThrottleHintEnum )
    {
        numProperties += 2;
    }
    if( addThrottleHintEnum )
    {
        numProperties += 2;
    }

    // Allocate a new array of properties.  We need to allocate two
    // properties for each pair, plus one property for the terminating
    // zero.
    pLocalQueueProperties = new cl_queue_properties[ numProperties + 1 ];
    if( pLocalQueueProperties )
    {
        // Copy the old properties array to the new properties array,
        // if the new properties array exists.
        numProperties = 0;
        if( properties )
        {
            while( properties[ numProperties ] != 0 )
            {
                pLocalQueueProperties[ numProperties ] = properties[ numProperties ];
                if( properties[ numProperties ] == CL_QUEUE_PROPERTIES )
                {
                    CLI_ASSERT( addCommandQueuePropertiesEnum == false );

                    cl_command_queue_properties props = properties[ numProperties + 1 ];

                    modifyCommandQueueProperties( props );

                    pLocalQueueProperties[ numProperties + 1 ] = props;
                }
                else
                {
                    pLocalQueueProperties[ numProperties + 1 ] =
                        properties[ numProperties + 1 ];
                }
                numProperties += 2;
            }
        }
        if( addPriorityHintEnum )
        {
            CLI_ASSERT( config().DefaultQueuePriorityHint != 0 );
            pLocalQueueProperties[ numProperties] = CL_QUEUE_PRIORITY_KHR;
            pLocalQueueProperties[ numProperties + 1 ] = config().DefaultQueuePriorityHint;
            numProperties += 2;
        }
        if( addThrottleHintEnum )
        {
            CLI_ASSERT( config().DefaultQueueThrottleHint != 0 );
            pLocalQueueProperties[ numProperties] = CL_QUEUE_THROTTLE_KHR;
            pLocalQueueProperties[ numProperties + 1 ] = config().DefaultQueueThrottleHint;
            numProperties += 2;
        }

        // This setting is added last in the list, in order to better behave with runtimes
        // truncating it when a property has a value of 0, which may be the case below.
        if( addCommandQueuePropertiesEnum )
        {
            cl_command_queue_properties props = 0;

            modifyCommandQueueProperties(props);

            pLocalQueueProperties[numProperties] = CL_QUEUE_PROPERTIES;
            pLocalQueueProperties[numProperties + 1] = props;
            numProperties += 2;
        }

        // Add the terminating zero.
        pLocalQueueProperties[ numProperties ] = 0;
    }
}